

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O3

void __thiscall FHealthBar::MakeTexture(FHealthBar *this)

{
  BYTE *pBVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar12;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  long lVar16;
  
  auVar2 = _DAT_0073b300;
  uVar5 = this->VialLevel;
  uVar7 = (ulong)uVar5;
  if (uVar7 == 999) {
    uVar5 = (uint)this->Colors[5] << 0x18 |
            (uint)this->Colors[5] << 8 | (uint)this->Colors[4] << 0x10 | (uint)this->Colors[4];
    lVar4 = 0;
    do {
      pBVar1 = this->Pixels + lVar4 * 4;
      *(uint *)pBVar1 = uVar5;
      *(uint *)(pBVar1 + 4) = uVar5;
      *(uint *)(pBVar1 + 8) = uVar5;
      *(uint *)(pBVar1 + 0xc) = uVar5;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 100);
  }
  else if ((int)uVar5 < 0x65) {
    if ((int)uVar5 < 0xb) {
      if (0 < (int)uVar5) {
        uVar3 = (uint)this->Colors[6] << 0x10 |
                (uint)this->Colors[7] << 8 | (uint)this->Colors[7] << 0x18 | (uint)this->Colors[6];
        lVar4 = uVar7 - 1;
        auVar8._8_4_ = (int)lVar4;
        auVar8._0_8_ = lVar4;
        auVar8._12_4_ = (int)((ulong)lVar4 >> 0x20);
        lVar4 = 0;
        auVar8 = auVar8 ^ _DAT_0073b300;
        auVar13 = _DAT_0073b2f0;
        do {
          auVar21 = auVar13 ^ auVar2;
          if ((bool)(~(auVar21._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar21._0_4_ ||
                      auVar8._4_4_ < auVar21._4_4_) & 1)) {
            *(uint *)(this->Pixels + lVar4) = uVar3;
          }
          if ((auVar21._12_4_ != auVar8._12_4_ || auVar21._8_4_ <= auVar8._8_4_) &&
              auVar21._12_4_ <= auVar8._12_4_) {
            *(uint *)(this->Pixels + lVar4 + 4) = uVar3;
          }
          lVar16 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar16 + 2;
          lVar4 = lVar4 + 8;
        } while ((ulong)(uVar5 + 1 >> 1) << 3 != lVar4);
      }
    }
    else {
      lVar4 = uVar7 - 1;
      auVar11._8_4_ = (int)lVar4;
      auVar11._0_8_ = lVar4;
      auVar11._12_4_ = (int)((ulong)lVar4 >> 0x20);
      if (uVar5 < 0x15) {
        uVar3 = (uint)this->Colors[4] << 0x10 | (uint)this->Colors[5] << 8 |
                (uint)this->Colors[5] << 0x18 | (uint)this->Colors[4];
        uVar7 = 0;
        auVar11 = auVar11 ^ _DAT_0073b300;
        auVar14 = _DAT_0073c1a0;
        auVar19 = _DAT_0073b2f0;
        do {
          auVar21 = auVar19 ^ auVar2;
          iVar12 = auVar11._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar12 && auVar11._0_4_ < auVar21._0_4_ ||
                      iVar12 < auVar21._4_4_) & 1)) {
            *(uint *)(this->Pixels + uVar7) = uVar3;
          }
          if ((auVar21._12_4_ != auVar11._12_4_ || auVar21._8_4_ <= auVar11._8_4_) &&
              auVar21._12_4_ <= auVar11._12_4_) {
            *(uint *)(this->Pixels + uVar7 + 4) = uVar3;
          }
          iVar23 = SUB164(auVar14 ^ auVar2,4);
          if (iVar23 <= iVar12 && (iVar23 != iVar12 || SUB164(auVar14 ^ auVar2,0) <= auVar11._0_4_))
          {
            *(uint *)(this->Pixels + uVar7 + 8) = uVar3;
            *(uint *)(this->Pixels + uVar7 + 0xc) = uVar3;
          }
          lVar4 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 4;
          auVar19._8_8_ = lVar4 + 4;
          lVar4 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 4;
          auVar14._8_8_ = lVar4 + 4;
          uVar7 = uVar7 + 0x10;
        } while ((uVar5 + 3 & 0x3c) << 2 != uVar7);
      }
      else {
        uVar3 = (uint)this->Colors[0] << 0x10 | (uint)this->Colors[1] << 8 |
                (uint)this->Colors[1] << 0x18 | (uint)this->Colors[0];
        lVar4 = 0;
        auVar11 = auVar11 ^ _DAT_0073b300;
        auVar15 = _DAT_0073c1a0;
        auVar20 = _DAT_0073b2f0;
        do {
          auVar21 = auVar20 ^ auVar2;
          iVar12 = auVar11._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar12 && auVar11._0_4_ < auVar21._0_4_ ||
                      iVar12 < auVar21._4_4_) & 1)) {
            *(uint *)(this->Pixels + lVar4) = uVar3;
          }
          if ((auVar21._12_4_ != auVar11._12_4_ || auVar21._8_4_ <= auVar11._8_4_) &&
              auVar21._12_4_ <= auVar11._12_4_) {
            *(uint *)(this->Pixels + lVar4 + 4) = uVar3;
          }
          iVar23 = SUB164(auVar15 ^ auVar2,4);
          if (iVar23 <= iVar12 && (iVar23 != iVar12 || SUB164(auVar15 ^ auVar2,0) <= auVar11._0_4_))
          {
            *(uint *)(this->Pixels + lVar4 + 8) = uVar3;
            *(uint *)(this->Pixels + lVar4 + 0xc) = uVar3;
          }
          lVar16 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 4;
          auVar20._8_8_ = lVar16 + 4;
          lVar16 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 4;
          auVar15._8_8_ = lVar16 + 4;
          lVar4 = lVar4 + 0x10;
        } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar4);
      }
    }
    iVar12 = this->VialLevel;
    if ((long)iVar12 < 100) {
      memset(this->Pixels + (long)iVar12 * 4,0,(ulong)(100 - iVar12) << 2);
      return;
    }
  }
  else {
    uVar3 = -uVar5 + 200;
    if (uVar5 < 200) {
      uVar6 = (uint)this->Colors[0] << 0x10 |
              (uint)this->Colors[1] << 8 | (uint)this->Colors[1] << 0x18 | (uint)this->Colors[0];
      lVar4 = (ulong)uVar3 - 1;
      auVar9._8_4_ = (int)lVar4;
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
      lVar4 = 0;
      auVar9 = auVar9 ^ _DAT_0073b300;
      auVar21 = _DAT_0073c1a0;
      auVar17 = _DAT_0073b2f0;
      do {
        auVar22 = auVar17 ^ auVar2;
        iVar12 = auVar9._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar12 && auVar9._0_4_ < auVar22._0_4_ ||
                    iVar12 < auVar22._4_4_) & 1)) {
          *(uint *)(this->Pixels + lVar4) = uVar6;
        }
        if ((auVar22._12_4_ != auVar9._12_4_ || auVar22._8_4_ <= auVar9._8_4_) &&
            auVar22._12_4_ <= auVar9._12_4_) {
          *(uint *)(this->Pixels + lVar4 + 4) = uVar6;
        }
        iVar23 = SUB164(auVar21 ^ auVar2,4);
        if (iVar23 <= iVar12 && (iVar23 != iVar12 || SUB164(auVar21 ^ auVar2,0) <= auVar9._0_4_)) {
          *(uint *)(this->Pixels + lVar4 + 8) = uVar6;
          *(uint *)(this->Pixels + lVar4 + 0xc) = uVar6;
        }
        lVar16 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 4;
        auVar17._8_8_ = lVar16 + 4;
        lVar16 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar16 + 4;
        lVar4 = lVar4 + 0x10;
      } while ((ulong)(-uVar5 + 0xcb >> 2) << 4 != lVar4);
    }
    auVar2 = _DAT_0073b300;
    uVar6 = (uint)this->Colors[2] << 0x10 |
            (uint)this->Colors[3] << 8 | (uint)this->Colors[3] << 0x18 | (uint)this->Colors[2];
    lVar4 = (ulong)(uVar5 - 100) - 1;
    auVar10._8_4_ = (int)lVar4;
    auVar10._0_8_ = lVar4;
    auVar10._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar7 = 0;
    auVar10 = auVar10 ^ _DAT_0073b300;
    auVar22 = _DAT_0073c1a0;
    auVar18 = _DAT_0073b2f0;
    do {
      auVar21 = auVar18 ^ auVar2;
      iVar12 = auVar10._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar12 && auVar10._0_4_ < auVar21._0_4_ ||
                  iVar12 < auVar21._4_4_) & 1)) {
        *(uint *)(this->Pixels + uVar7 * 4 + (long)(int)(uVar3 * 4)) = uVar6;
      }
      if ((auVar21._12_4_ != auVar10._12_4_ || auVar21._8_4_ <= auVar10._8_4_) &&
          auVar21._12_4_ <= auVar10._12_4_) {
        *(uint *)(this->Pixels + uVar7 * 4 + (long)(int)(uVar3 * 4) + 4) = uVar6;
      }
      auVar21 = auVar22 ^ auVar2;
      iVar23 = auVar21._4_4_;
      if (iVar23 <= iVar12 && (iVar23 != iVar12 || auVar21._0_4_ <= auVar10._0_4_)) {
        *(uint *)(this->Pixels + uVar7 * 4 + (long)(int)(uVar3 * 4) + 8) = uVar6;
        *(uint *)(this->Pixels + uVar7 * 4 + (long)(int)(uVar3 * 4) + 0xc) = uVar6;
      }
      uVar7 = uVar7 + 4;
      lVar4 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar4 + 4;
      lVar4 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 4;
      auVar22._8_8_ = lVar4 + 4;
    } while ((uVar5 - 0x61 & 0xfffffffc) != uVar7);
  }
  return;
}

Assistant:

void FHealthBar::MakeTexture ()
{
	if (VialLevel == 999)
	{
		FillBar (0, 100, Colors[4], Colors[5]);
	}
	else
	{
		if (VialLevel <= 100)
		{
			if (VialLevel <= 10)
			{
				FillBar (0, VialLevel, Colors[6], Colors[7]);
			}
			else if (VialLevel <= 20)
			{
				FillBar (0, VialLevel, Colors[4], Colors[5]);
			}
			else
			{
				FillBar (0, VialLevel, Colors[0], Colors[1]);
			}
			FillBar (VialLevel, 100, 0, 0);
		}
		else
		{
			int stop = 100 - (VialLevel - 100);
			FillBar (0, stop, Colors[0], Colors[1]);
			FillBar (stop, 100, Colors[2], Colors[3]);
		}
	}
}